

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_iMultiFab.cpp
# Opt level: O2

Long __thiscall amrex::iMultiFab::sum(iMultiFab *this,int comp,int nghost,bool local)

{
  int i;
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  Box local_ec;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
  lVar6 = 0;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_ec,&mfi,nghost);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,&this->super_FabArray<amrex::IArrayBox>,&mfi);
    lVar3 = (long)local_ec.smallend.vect[2];
    piVar7 = (int *)(local_d0.nstride * (long)comp * 4 +
                     (lVar3 - local_d0.begin.z) * local_d0.kstride * 4 +
                     ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) *
                     local_d0.jstride * 4 + (long)local_ec.smallend.vect[0] * 4 +
                     (long)local_d0.begin.x * -4 + (long)local_d0.p);
    for (; lVar2 = (long)local_ec.smallend.vect[1], piVar4 = piVar7,
        lVar3 <= local_ec.bigend.vect[2]; lVar3 = lVar3 + 1) {
      for (; lVar1 = (long)local_ec.smallend.vect[0], piVar5 = piVar4,
          lVar2 <= local_ec.bigend.vect[1]; lVar2 = lVar2 + 1) {
        for (; lVar1 <= local_ec.bigend.vect[0]; lVar1 = lVar1 + 1) {
          lVar6 = lVar6 + *piVar5;
          piVar5 = piVar5 + 1;
        }
        piVar4 = piVar4 + local_d0.jstride;
      }
      piVar7 = piVar7 + local_d0.kstride;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return lVar6;
}

Assistant:

Long
iMultiFab::sum (int comp, int nghost, bool local) const
{
    BL_PROFILE("iMultiFab::sum()");

    AMREX_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    Long sm = 0;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto const& ma = this->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Long>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Long>
        {
            return { static_cast<Long>(ma[box_no](i,j,k,comp)) };
        });
    }
    else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            Array4<int const> const& fab = this->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                sm += fab(i,j,k,comp);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}